

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptParenExpression(HlslGrammar *this,TIntermTyped **expression)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermNode *local_30;
  TIntermNode *declNode;
  TIntermTyped **ppTStack_20;
  bool decl;
  TIntermTyped **expression_local;
  HlslGrammar *this_local;
  
  *expression = (TIntermTyped *)0x0;
  ppTStack_20 = expression;
  expression_local = (TIntermTyped **)this;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
  if (!bVar1) {
    expected(this,"(");
  }
  declNode._7_1_ = 0;
  local_30 = (TIntermNode *)0x0;
  declNode._7_1_ = acceptControlDeclaration(this,&local_30);
  if ((bool)declNode._7_1_) {
    if ((local_30 == (TIntermNode *)0x0) ||
       (iVar2 = (*local_30->_vptr_TIntermNode[3])(), CONCAT44(extraout_var,iVar2) == 0)) {
      expected(this,"initialized declaration");
      return false;
    }
    iVar2 = (*local_30->_vptr_TIntermNode[3])();
    *ppTStack_20 = (TIntermTyped *)CONCAT44(extraout_var_00,iVar2);
  }
  else {
    bVar1 = acceptExpression(this,ppTStack_20);
    if (!bVar1) {
      expected(this,"expression");
      return false;
    }
  }
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
  if (!bVar1) {
    expected(this,")");
  }
  return true;
}

Assistant:

bool HlslGrammar::acceptParenExpression(TIntermTyped*& expression)
{
    expression = nullptr;

    // LEFT_PAREN
    if (! acceptTokenClass(EHTokLeftParen))
        expected("(");

    bool decl = false;
    TIntermNode* declNode = nullptr;
    decl = acceptControlDeclaration(declNode);
    if (decl) {
        if (declNode == nullptr || declNode->getAsTyped() == nullptr) {
            expected("initialized declaration");
            return false;
        } else
            expression = declNode->getAsTyped();
    } else {
        // no declaration
        if (! acceptExpression(expression)) {
            expected("expression");
            return false;
        }
    }

    // RIGHT_PAREN
    if (! acceptTokenClass(EHTokRightParen))
        expected(")");

    return true;
}